

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall gl4cts::ShaderSubroutine::FunctionalTest12::testImage(FunctionalTest12 *this)

{
  bool bVar1;
  GLuint subroutine_index;
  GLuint subroutine_index_00;
  GLuint GVar2;
  socklen_t sVar3;
  GLchar *pGVar4;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int iVar5;
  Context **texture;
  bool local_b1;
  bool result;
  GLuint right_to_left;
  GLuint left_to_right;
  vertexArray vao;
  texture red_texture;
  program program;
  framebuffer framebuffer;
  texture color_texture;
  undefined1 local_30 [8];
  texture destination_texture;
  texture blue_texture;
  FunctionalTest12 *this_local;
  
  Utils::texture::texture
            ((texture *)&destination_texture.m_context,(this->super_TestCase).m_context);
  Utils::texture::texture((texture *)local_30,(this->super_TestCase).m_context);
  Utils::texture::texture((texture *)&framebuffer.m_context,(this->super_TestCase).m_context);
  Utils::framebuffer::framebuffer
            ((framebuffer *)&program.m_context,(this->super_TestCase).m_context);
  Utils::program::program((program *)&red_texture.m_context,(this->super_TestCase).m_context);
  Utils::texture::texture((texture *)&vao.m_context,(this->super_TestCase).m_context);
  Utils::vertexArray::vertexArray((vertexArray *)&right_to_left,(this->super_TestCase).m_context);
  iVar5 = 0;
  pGVar4 = testImage::geometry_shader_code;
  Utils::program::build
            ((program *)&red_texture.m_context,(GLchar *)0x0,testImage::fragment_shader_code,
             testImage::geometry_shader_code,(GLchar *)0x0,(GLchar *)0x0,
             testImage::vertex_shader_code,(GLchar **)0x0,0,false);
  sVar3 = (socklen_t)pGVar4;
  Utils::program::use((program *)&red_texture.m_context);
  Utils::vertexArray::generate((vertexArray *)&right_to_left);
  Utils::vertexArray::bind((vertexArray *)&right_to_left,iVar5,__addr,sVar3);
  Utils::texture::create((texture *)&destination_texture.m_context,0x10,0x10,0x8d70);
  Utils::texture::create((texture *)local_30,0x10,0x10,0x8d70);
  Utils::texture::create((texture *)&framebuffer.m_context,0x10,0x10,0x8d70);
  sVar3 = 0x8d70;
  Utils::texture::create((texture *)&vao.m_context,0x10,0x10,0x8d70);
  fillTexture(this,(texture *)&destination_texture.m_context,testImage::blue_color);
  fillTexture(this,(texture *)local_30,testImage::clean_color);
  texture = &vao.m_context;
  fillTexture(this,(texture *)texture,testImage::red_color);
  iVar5 = (int)texture;
  Utils::framebuffer::generate((framebuffer *)&program.m_context);
  Utils::framebuffer::bind((framebuffer *)&program.m_context,iVar5,__addr_00,sVar3);
  Utils::framebuffer::attachTexture
            ((framebuffer *)&program.m_context,0x8ce0,(GLuint)framebuffer.m_context,0x10,0x10);
  Utils::framebuffer::clearColor((framebuffer *)&program.m_context,0.0,0.0,0.0,0.0);
  Utils::framebuffer::clear((framebuffer *)&program.m_context,0x4000);
  subroutine_index =
       Utils::program::getSubroutineIndex
                 ((program *)&red_texture.m_context,testImage::subroutine_names[0],0x8b30);
  subroutine_index_00 =
       Utils::program::getSubroutineIndex
                 ((program *)&red_texture.m_context,testImage::subroutine_names[1],0x8b30);
  GVar2 = Utils::program::getUniformLocation
                    ((program *)&red_texture.m_context,testImage::uniform_names[0]);
  this->m_left_image = GVar2;
  GVar2 = Utils::program::getUniformLocation
                    ((program *)&red_texture.m_context,testImage::uniform_names[1]);
  this->m_right_image = GVar2;
  local_b1 = testImageDraw(this,subroutine_index,(texture *)&destination_texture.m_context,
                           (texture *)local_30,testImage::blue_color,testImage::blue_color);
  bVar1 = testImageDraw(this,subroutine_index,(texture *)&vao.m_context,(texture *)local_30,
                        testImage::red_color,testImage::red_color);
  if (!bVar1) {
    local_b1 = false;
  }
  bVar1 = testImageDraw(this,subroutine_index_00,(texture *)local_30,
                        (texture *)&destination_texture.m_context,testImage::blue_color,
                        testImage::blue_color);
  if (!bVar1) {
    local_b1 = false;
  }
  bVar1 = testImageDraw(this,subroutine_index_00,(texture *)local_30,(texture *)&vao.m_context,
                        testImage::red_color,testImage::red_color);
  if (!bVar1) {
    local_b1 = false;
  }
  bVar1 = testImageDraw(this,subroutine_index,(texture *)&destination_texture.m_context,
                        (texture *)&vao.m_context,testImage::blue_color,testImage::blue_color);
  if (!bVar1) {
    local_b1 = false;
  }
  Utils::vertexArray::~vertexArray((vertexArray *)&right_to_left);
  Utils::texture::~texture((texture *)&vao.m_context);
  Utils::program::~program((program *)&red_texture.m_context);
  Utils::framebuffer::~framebuffer((framebuffer *)&program.m_context);
  Utils::texture::~texture((texture *)&framebuffer.m_context);
  Utils::texture::~texture((texture *)local_30);
  Utils::texture::~texture((texture *)&destination_texture.m_context);
  return local_b1;
}

Assistant:

bool FunctionalTest12::testImage()
{
	static const GLchar* fragment_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_image_load_store : require\n"
		"#extension GL_ARB_shader_subroutine       : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"layout(location = 0) out uvec4 out_color;\n"
		"\n"
		"layout(rgba32ui) uniform uimage2D left_image;\n"
		"layout(rgba32ui) uniform uimage2D right_image;\n"
		"\n"
		"subroutine void image_routine(void);\n"
		"\n"
		"subroutine(image_routine) void left_to_right(void)\n"
		"{\n"
		"    out_color = imageLoad (left_image,  ivec2(gl_FragCoord.xy));\n"
		"                imageStore(right_image, ivec2(gl_FragCoord.xy), out_color);\n"
		"}\n"
		"\n"
		"subroutine(image_routine) void right_to_left(void)\n"
		"{\n"
		"    out_color = imageLoad (right_image, ivec2(gl_FragCoord.xy));\n"
		"                imageStore(left_image,  ivec2(gl_FragCoord.xy), out_color);\n"
		"}\n"
		"\n"
		"subroutine uniform image_routine routine;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    routine();\n"
		"}\n"
		"\n";

	static const GLchar* geometry_shader_code = "#version 400 core\n"
												"#extension GL_ARB_shader_subroutine : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"layout(points)                           in;\n"
												"layout(triangle_strip, max_vertices = 4) out;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    gl_Position = vec4(-1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4(-1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    EndPrimitive();\n"
												"}\n"
												"\n";

	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "}\n"
											  "\n";

	static const GLchar* subroutine_names[] = { "left_to_right", "right_to_left" };

	static const GLchar* uniform_names[] = { "left_image", "right_image" };

	/* Test data */
	static const GLuint blue_color[4]  = { 0, 0, 255, 255 };
	static const GLuint clean_color[4] = { 16, 32, 64, 128 };
	static const GLuint red_color[4]   = { 255, 0, 0, 255 };

	/* GL objects */
	Utils::texture	 blue_texture(m_context);
	Utils::texture	 destination_texture(m_context);
	Utils::texture	 color_texture(m_context);
	Utils::framebuffer framebuffer(m_context);
	Utils::program	 program(m_context);
	Utils::texture	 red_texture(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, fragment_shader_code /* fs */, geometry_shader_code /* gs */, 0 /* tcs */, 0 /* test */,
				  vertex_shader_code, 0 /* varying_names */, 0 /* n_varyings */);

	program.use();

	vao.generate();
	vao.bind();

	blue_texture.create(m_texture_width, m_texture_height, GL_RGBA32UI);
	destination_texture.create(m_texture_width, m_texture_height, GL_RGBA32UI);
	color_texture.create(m_texture_width, m_texture_height, GL_RGBA32UI);
	red_texture.create(m_texture_width, m_texture_height, GL_RGBA32UI);

	fillTexture(blue_texture, blue_color);
	fillTexture(destination_texture, clean_color);
	fillTexture(red_texture, red_color);

	framebuffer.generate();
	framebuffer.bind();
	framebuffer.attachTexture(GL_COLOR_ATTACHMENT0, color_texture.m_id, m_texture_width, m_texture_height);
	framebuffer.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	framebuffer.clear(GL_COLOR_BUFFER_BIT);

	/* Subroutine indices */
	GLuint left_to_right = program.getSubroutineIndex(subroutine_names[0], GL_FRAGMENT_SHADER);
	GLuint right_to_left = program.getSubroutineIndex(subroutine_names[1], GL_FRAGMENT_SHADER);

	/* Uniform locations */
	m_left_image  = program.getUniformLocation(uniform_names[0]);
	m_right_image = program.getUniformLocation(uniform_names[1]);

	/* Test */
	bool result = true;

	if (false == testImageDraw(left_to_right, blue_texture, destination_texture, blue_color, blue_color))
	{
		result = false;
	}

	if (false == testImageDraw(left_to_right, red_texture, destination_texture, red_color, red_color))
	{
		result = false;
	}

	if (false == testImageDraw(right_to_left, destination_texture, blue_texture, blue_color, blue_color))
	{
		result = false;
	}

	if (false == testImageDraw(right_to_left, destination_texture, red_texture, red_color, red_color))
	{
		result = false;
	}

	if (false == testImageDraw(left_to_right, blue_texture, red_texture, blue_color, blue_color))
	{
		result = false;
	}

	/* Done */
	return result;
}